

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_check_requires(nn_parse_context *ctx)

{
  nn_option *pnVar1;
  unsigned_long mask;
  ulong uVar2;
  
  pnVar1 = ctx->options;
  uVar2 = 0;
  while( true ) {
    if (pnVar1->longname == (char *)0x0) {
      if ((ctx->requires & ~ctx->mask) != 0) goto LAB_00103eef;
      return;
    }
    if (((ctx->last_option_usage[uVar2] != (char *)0x0) && (pnVar1->requires_mask != 0)) &&
       ((pnVar1->requires_mask & ~ctx->mask) != 0)) break;
    uVar2 = uVar2 + 1;
    pnVar1 = pnVar1 + 1;
  }
  fprintf(_stderr,"%s: Option",*ctx->argv);
  nn_print_option(ctx,(int)uVar2,(FILE *)_stderr);
  fwrite("requires at least one of the following options:\n",0x30,1,_stderr);
  mask = ctx->options[uVar2 & 0xffffffff].requires_mask;
  do {
    nn_print_requires(ctx,mask);
LAB_00103eef:
    fprintf(_stderr,"%s: At least one of the following required:\n",*ctx->argv);
    mask = ~ctx->mask & ctx->requires;
  } while( true );
}

Assistant:

void nn_check_requires (struct nn_parse_context *ctx) {
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!ctx->last_option_usage[i])
            continue;
        if (opt->requires_mask &&
            (opt->requires_mask & ctx->mask) != opt->requires_mask) {
            nn_option_requires (ctx, i);
        }
    }

    if ((ctx->requires & ctx->mask) != ctx->requires) {
        fprintf (stderr, "%s: At least one of the following required:\n",
            ctx->argv[0]);
        nn_print_requires (ctx, ctx->requires & ~ctx->mask);
        exit (1);
    }
}